

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O2

void __thiscall NaDynAr<NaLinearUnit>::item::~item(item *this)

{
  NaLinearUnit *pNVar1;
  
  pNVar1 = this->pData;
  if (pNVar1 == (NaLinearUnit *)0x0) {
    NaPrintLog("data=0x%08p removed twice\n",0);
    pNVar1 = this->pData;
    if (pNVar1 == (NaLinearUnit *)0x0) goto LAB_00102d84;
  }
  (**(code **)(*(long *)pNVar1 + 0x10))();
LAB_00102d84:
  this->pData = (NaLinearUnit *)0x0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }